

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void Curl_verboseconnect(connectdata *conn)

{
  long lVar1;
  
  if ((conn->data->set).verbose == true) {
    lVar1 = 0x128;
    if ((((conn->bits).socksproxy == false) && (lVar1 = 0x168, (conn->bits).httpproxy == false)) &&
       (lVar1 = 0xd8, (conn->bits).conn_to_host != false)) {
      lVar1 = 0x108;
    }
    Curl_infof(conn->data,"Connected to %s (%s) port %ld (#%ld)\n",
               *(undefined8 *)((conn->chunk).hexbuffer + lVar1 + -0x20),conn->ip_addr_str,conn->port
               ,conn->connection_id);
    return;
  }
  return;
}

Assistant:

void Curl_verboseconnect(struct connectdata *conn)
{
  if(conn->data->set.verbose)
    infof(conn->data, "Connected to %s (%s) port %ld (#%ld)\n",
          conn->bits.socksproxy ? conn->socks_proxy.host.dispname :
          conn->bits.httpproxy ? conn->http_proxy.host.dispname :
          conn->bits.conn_to_host ? conn->conn_to_host.dispname :
          conn->host.dispname,
          conn->ip_addr_str, conn->port, conn->connection_id);
}